

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_php.cpp
# Opt level: O0

string * __thiscall
flatbuffers::php::PhpGenerator::GenTypePointer_abi_cxx11_
          (string *__return_storage_ptr__,PhpGenerator *this,Type *type)

{
  Type *type_00;
  allocator<char> local_51;
  undefined1 local_50 [64];
  Type *type_local;
  
  local_50._56_8_ = this;
  type_local = (Type *)__return_storage_ptr__;
  switch(*(undefined4 *)&(this->super_BaseGenerator)._vptr_BaseGenerator) {
  case 0xd:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"string",(allocator<char> *)(local_50 + 0x37));
    std::allocator<char>::~allocator((allocator<char> *)(local_50 + 0x37));
    break;
  case 0xe:
    Type::VectorType((Type *)local_50,(Type *)this);
    GenTypeGet_abi_cxx11_(__return_storage_ptr__,(PhpGenerator *)local_50,type_00);
    break;
  case 0xf:
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(this->super_BaseGenerator).parser_);
    break;
  case 0x10:
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Table",&local_51);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string GenTypePointer(const Type &type) {
    switch (type.base_type) {
      case BASE_TYPE_STRING: return "string";
      case BASE_TYPE_VECTOR: return GenTypeGet(type.VectorType());
      case BASE_TYPE_STRUCT: return type.struct_def->name;
      case BASE_TYPE_UNION:
        // fall through
      default: return "Table";
    }
  }